

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitParenthesizedDeclarator
          (SyntaxDumper *this,ParenthesizedDeclaratorSyntax *node)

{
  DeclaratorSyntax *pDVar1;
  SyntaxToken local_98;
  SyntaxToken local_50;
  ParenthesizedDeclaratorSyntax *local_18;
  ParenthesizedDeclaratorSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ParenthesizedDeclaratorSyntax *)this;
  ParenthesizedDeclaratorSyntax::openParenthesisToken(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  pDVar1 = ParenthesizedDeclaratorSyntax::innerDeclarator(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pDVar1);
  ParenthesizedDeclaratorSyntax::closeParenthesisToken(&local_98,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_98,local_18);
  SyntaxToken::~SyntaxToken(&local_98);
  return Skip;
}

Assistant:

virtual Action visitParenthesizedDeclarator(const ParenthesizedDeclaratorSyntax* node) override
    {
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->innerDeclarator());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }